

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

void __thiscall
google::anon_unknown_1::FlagValue::FlagValue
          (FlagValue *this,void *valbuf,char *type,bool transfer_ownership_of_value)

{
  int iVar1;
  long lVar2;
  char *__s2;
  
  this->value_buffer_ = valbuf;
  this->owns_value_ = transfer_ownership_of_value;
  this->type_ = '\0';
  __s2 = "bool";
  lVar2 = -7;
  do {
    iVar1 = strcmp(type,__s2);
    if (iVar1 == 0) {
      return;
    }
    this->type_ = (char)lVar2 + '\b';
    __s2 = __s2 + 7;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  __assert_fail("type_ <= FV_MAX_INDEX",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                ,0xfe,
                "google::(anonymous namespace)::FlagValue::FlagValue(void *, const char *, bool)");
}

Assistant:

FlagValue::FlagValue(void* valbuf, const char* type,
                     bool transfer_ownership_of_value)
    : value_buffer_(valbuf),
      owns_value_(transfer_ownership_of_value) {
  for (type_ = 0; type_ <= FV_MAX_INDEX; ++type_) {
    if (!strcmp(type, TypeName())) {
      break;
    }
  }
  assert(type_ <= FV_MAX_INDEX);  // Unknown typename
}